

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O2

Object * __thiscall
flatbuffers::BaseBfbsGenerator::GetObjectByIndex(BaseBfbsGenerator *this,int32_t index)

{
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar1;
  return_type pOVar2;
  
  if (-1 < index && this->schema_ != (Schema *)0x0) {
    pVVar1 = reflection::Schema::objects(this->schema_);
    if (index < *(int *)pVVar1) {
      pVVar1 = reflection::Schema::objects(this->schema_);
      pOVar2 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get(pVVar1,index);
      return pOVar2;
    }
  }
  return (Object *)0x0;
}

Assistant:

const reflection::Object *GetObjectByIndex(int32_t index) const {
    if (!schema_ || index < 0 ||
        index >= static_cast<int32_t>(schema_->objects()->size())) {
      return nullptr;
    }
    return schema_->objects()->Get(index);
  }